

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

cmPropertyDefinition * __thiscall
cmState::GetPropertyDefinition(cmState *this,string *name,ScopeType scope)

{
  _Base_ptr p_Var1;
  bool bVar2;
  _Base_ptr p_Var3;
  const_iterator cVar4;
  cmPropertyDefinition *pcVar5;
  _Base_ptr p_Var6;
  
  bVar2 = IsPropertyDefined(this,name,scope);
  if (bVar2) {
    p_Var6 = &(this->PropertyDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var3 = p_Var6;
    for (p_Var1 = (this->PropertyDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
        ; p_Var1 != (_Base_ptr)0x0;
        p_Var1 = (&p_Var1->_M_left)[(int)p_Var1[1]._M_color < (int)scope]) {
      if ((int)scope <= (int)p_Var1[1]._M_color) {
        p_Var3 = p_Var1;
      }
    }
    if ((p_Var3 != p_Var6) && ((int)p_Var3[1]._M_color <= (int)scope)) {
      p_Var6 = p_Var3;
    }
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPropertyDefinition>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPropertyDefinition>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPropertyDefinition>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPropertyDefinition>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPropertyDefinition>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPropertyDefinition>_>_>
                    *)&p_Var6[1]._M_parent,name);
    pcVar5 = (cmPropertyDefinition *)(cVar4._M_node + 2);
  }
  else {
    pcVar5 = (cmPropertyDefinition *)0x0;
  }
  return pcVar5;
}

Assistant:

cmPropertyDefinition const* cmState
::GetPropertyDefinition(const std::string& name,
                        cmProperty::ScopeType scope) const
{
  if (this->IsPropertyDefined(name,scope))
    {
    cmPropertyDefinitionMap const& defs =
        this->PropertyDefinitions.find(scope)->second;
    return &defs.find(name)->second;
    }
  return 0;
}